

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.h
# Opt level: O0

void __thiscall
libDAI::Box::Box(Box *this,VarSet *ns,
                vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *points)

{
  size_type sVar1;
  size_t sVar2;
  vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *in_RDX;
  VarSet *in_RSI;
  TProb<double> *in_RDI;
  undefined1 auVar3 [16];
  undefined1 in_ZMM0 [64];
  size_t i;
  size_t N;
  double x;
  VarSet *in_stack_ffffffffffffff18;
  VarSet *in_stack_ffffffffffffff20;
  TProb<double> *b;
  pointer *a;
  TProb<double> *in_stack_ffffffffffffff60;
  ulong local_70;
  
  auVar3 = in_ZMM0._0_16_;
  b = in_RDI;
  VarSet::VarSet(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  a = &b[1]._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  TProb<double>::TProb((TProb<double> *)in_stack_ffffffffffffff20);
  TProb<double>::TProb((TProb<double> *)in_stack_ffffffffffffff20);
  sVar1 = std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::size(in_RDX);
  if (sVar1 == 0) {
    sVar2 = VarSet::stateSpace(in_RSI);
    vcvtusi2sd_avx512f(auVar3,sVar2);
    VarSet::stateSpace(in_RSI);
    TProb<double>::TProb(in_stack_ffffffffffffff60,(size_t)a,(Real)b);
    TProb<double>::operator=
              ((TProb<double> *)in_stack_ffffffffffffff20,(TProb<double> *)in_stack_ffffffffffffff18
              );
    TProb<double>::~TProb((TProb<double> *)0xb12467);
    VarSet::stateSpace(in_RSI);
    TProb<double>::TProb(in_stack_ffffffffffffff60,(size_t)a,(Real)b);
    TProb<double>::operator=
              ((TProb<double> *)in_stack_ffffffffffffff20,(TProb<double> *)in_stack_ffffffffffffff18
              );
    TProb<double>::~TProb((TProb<double> *)0xb124b4);
  }
  else {
    VarSet::stateSpace(in_RSI);
    std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::operator[]
              (in_RDX,0);
    TProb<double>::operator=
              ((TProb<double> *)in_stack_ffffffffffffff20,(TProb<double> *)in_stack_ffffffffffffff18
              );
    TProb<double>::operator=
              ((TProb<double> *)in_stack_ffffffffffffff20,(TProb<double> *)in_stack_ffffffffffffff18
              );
    for (local_70 = 1;
        sVar1 = std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::size
                          (in_RDX), local_70 < sVar1; local_70 = local_70 + 1) {
      std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::operator[]
                (in_RDX,local_70);
      min<double>((TProb<double> *)a,b);
      TProb<double>::operator=
                ((TProb<double> *)in_stack_ffffffffffffff20,
                 (TProb<double> *)in_stack_ffffffffffffff18);
      TProb<double>::~TProb((TProb<double> *)0xb12627);
      in_stack_ffffffffffffff20 =
           (VarSet *)
           &in_RDI[2]._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish;
      std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::operator[]
                (in_RDX,local_70);
      max<double>((TProb<double> *)a,b);
      TProb<double>::operator=
                ((TProb<double> *)in_stack_ffffffffffffff20,
                 (TProb<double> *)in_stack_ffffffffffffff18);
      TProb<double>::~TProb((TProb<double> *)0xb1267a);
    }
  }
  return;
}

Assistant:

Box(const VarSet &ns, const std::vector<Prob> &points) : _vars(ns) {
                if( points.size() == 0 ) {
                    double x = 1.0 / ns.stateSpace();
                    _min = Prob(ns.stateSpace(), x);
                    _max = Prob(ns.stateSpace(), x);
                } else {
                    size_t N = ns.stateSpace();
                    assert( points[0].size() == N );
                    _min = _max = points[0];
                    for( size_t i = 1; i < points.size(); i++ ) {
                        assert( points[i].size() == N );
                        _min = libDAI::min( _min, points[i] );
                        _max = libDAI::max( _max, points[i] );
                    }
                }
            }